

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bs2051.cpp
# Opt level: O2

Layout * ear::getLayout(Layout *__return_storage_ptr__,string *name)

{
  bool bVar1;
  unknown_layout *this;
  __normal_iterator<const_ear::Layout_*,_std::vector<ear::Layout,_std::allocator<ear::Layout>_>_>
  __it;
  long lVar2;
  long lVar3;
  __normal_iterator<const_ear::Layout_*,_std::vector<ear::Layout,_std::allocator<ear::Layout>_>_>
  _Var4;
  string *local_48;
  Layout *local_40;
  string *local_38;
  
  local_40 = DAT_001ecba8;
  lVar3 = (long)DAT_001ecba8 - (long)BS2051_LAYOUTS;
  __it._M_current = BS2051_LAYOUTS;
  local_48 = name;
  local_38 = name;
  for (lVar2 = lVar3 / 0x70 >> 2; 0 < lVar2; lVar2 = lVar2 + -1) {
    bVar1 = __gnu_cxx::__ops::_Iter_pred<ear::getLayout(std::__cxx11::string_const&)::$_0>::
            operator()((_Iter_pred<ear::getLayout(std::__cxx11::string_const&)::__0> *)&local_48,
                       __it);
    _Var4._M_current = __it._M_current;
    if (bVar1) goto LAB_0012fda8;
    bVar1 = __gnu_cxx::__ops::_Iter_pred<ear::getLayout(std::__cxx11::string_const&)::$_0>::
            operator()((_Iter_pred<ear::getLayout(std::__cxx11::string_const&)::__0> *)&local_48,
                       __it._M_current + 1);
    _Var4._M_current = __it._M_current + 1;
    if (bVar1) goto LAB_0012fda8;
    bVar1 = __gnu_cxx::__ops::_Iter_pred<ear::getLayout(std::__cxx11::string_const&)::$_0>::
            operator()((_Iter_pred<ear::getLayout(std::__cxx11::string_const&)::__0> *)&local_48,
                       __it._M_current + 2);
    _Var4._M_current = __it._M_current + 2;
    if (bVar1) goto LAB_0012fda8;
    bVar1 = __gnu_cxx::__ops::_Iter_pred<ear::getLayout(std::__cxx11::string_const&)::$_0>::
            operator()((_Iter_pred<ear::getLayout(std::__cxx11::string_const&)::__0> *)&local_48,
                       __it._M_current + 3);
    _Var4._M_current = __it._M_current + 3;
    if (bVar1) goto LAB_0012fda8;
    __it._M_current = __it._M_current + 4;
    lVar3 = lVar3 + -0x1c0;
  }
  lVar3 = lVar3 / 0x70;
  if (lVar3 != 1) {
    if (lVar3 != 2) {
      _Var4._M_current = local_40;
      if ((lVar3 != 3) ||
         (bVar1 = __gnu_cxx::__ops::_Iter_pred<ear::getLayout(std::__cxx11::string_const&)::$_0>::
                  operator()((_Iter_pred<ear::getLayout(std::__cxx11::string_const&)::__0> *)
                             &local_48,__it), _Var4._M_current = __it._M_current, bVar1))
      goto LAB_0012fda8;
      __it._M_current = __it._M_current + 1;
    }
    bVar1 = __gnu_cxx::__ops::_Iter_pred<ear::getLayout(std::__cxx11::string_const&)::$_0>::
            operator()((_Iter_pred<ear::getLayout(std::__cxx11::string_const&)::__0> *)&local_48,
                       __it);
    _Var4._M_current = __it._M_current;
    if (bVar1) goto LAB_0012fda8;
    __it._M_current = __it._M_current + 1;
  }
  bVar1 = __gnu_cxx::__ops::_Iter_pred<ear::getLayout(std::__cxx11::string_const&)::$_0>::operator()
                    ((_Iter_pred<ear::getLayout(std::__cxx11::string_const&)::__0> *)&local_48,__it)
  ;
  _Var4._M_current = local_40;
  if (bVar1) {
    _Var4._M_current = __it._M_current;
  }
LAB_0012fda8:
  if (_Var4._M_current == DAT_001ecba8) {
    this = (unknown_layout *)__cxa_allocate_exception(0x10);
    unknown_layout::unknown_layout(this,local_38);
    __cxa_throw(this,&unknown_layout::typeinfo,std::invalid_argument::~invalid_argument);
  }
  Layout::Layout(__return_storage_ptr__,_Var4._M_current);
  return __return_storage_ptr__;
}

Assistant:

Layout getLayout(const std::string& name) {
    auto& layouts = loadLayouts();
    auto it = std::find_if(
        layouts.begin(), layouts.end(),
        [&name](const Layout& l) -> bool { return l.name() == name; });
    if (it == layouts.end()) {
      throw unknown_layout(name);
    }
    return *it;
  }